

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O2

bool dxil_spv::analyze_alloca_instruction(Impl *impl,AllocaInst *inst)

{
  uint uVar1;
  TypeID TVar2;
  Type *pTVar3;
  ArrayType *this;
  mapped_type *pmVar4;
  AllocaInst *local_18;
  
  local_18 = inst;
  pTVar3 = LLVMBC::Value::getType((Value *)inst);
  uVar1 = LLVMBC::Type::getAddressSpace(pTVar3);
  if ((char)uVar1 == '\0') {
    pTVar3 = LLVMBC::Value::getType((Value *)inst);
    pTVar3 = LLVMBC::Type::getPointerElementType(pTVar3);
    this = LLVMBC::dyn_cast<LLVMBC::ArrayType>(pTVar3);
    if (this != (ArrayType *)0x0) {
      pTVar3 = LLVMBC::Type::getArrayElementType(&this->super_Type);
      TVar2 = LLVMBC::Type::getTypeID(pTVar3);
      if (TVar2 != FloatTyID) {
        if (TVar2 != IntegerTyID) {
          return true;
        }
        uVar1 = LLVMBC::Type::getIntegerBitWidth(pTVar3);
        if (uVar1 != 0x20) {
          return true;
        }
      }
      pmVar4 = std::__detail::
               _Map_base<const_LLVMBC::AllocaInst_*,_std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::AllocaInst_*>,_std::hash<const_LLVMBC::AllocaInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_LLVMBC::AllocaInst_*,_std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::AllocaInst_*>,_std::hash<const_LLVMBC::AllocaInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->alloca_tracking,&local_18);
      pmVar4->cbv_handle = (Value *)0x0;
      pmVar4->scalar_index_offset = 0;
      pmVar4->stride = 0;
      *(undefined8 *)((long)&pmVar4->scalar_index_offset + 1) = 0;
      *(undefined8 *)((long)&pmVar4->highest_store_index + 1) = 0;
    }
  }
  return true;
}

Assistant:

bool analyze_alloca_instruction(Converter::Impl &impl, const llvm::AllocaInst *inst)
{
	// Only attempt to track simple 32-bit scalar cases.
	// We don't want to deal with DXR vector types, or weird 16-bit promotion shenanigans.
	if (DXIL::AddressSpace(inst->getType()->getAddressSpace()) != DXIL::AddressSpace::Thread)
		return true;

	if (const auto *array_type = llvm::dyn_cast<llvm::ArrayType>(inst->getType()->getPointerElementType()))
	{
		auto *elem_type = array_type->getArrayElementType();
		bool simple_scalar;

		switch (elem_type->getTypeID())
		{
		case llvm::Type::TypeID::FloatTyID:
			simple_scalar = true;
			break;

		case llvm::Type::TypeID::IntegerTyID:
			simple_scalar = elem_type->getIntegerBitWidth() == 32;
			break;

		default:
			simple_scalar = false;
			break;
		}

		if (simple_scalar)
			impl.alloca_tracking[inst] = {};
	}

	return true;
}